

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall
QMdi::RegularTiler::rearrange(RegularTiler *this,QList<QWidget_*> *widgets,QRect *domain)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  QWidget *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  LayoutDirection direction;
  int iVar11;
  int iVar12;
  int col;
  int iVar13;
  int iVar14;
  Representation RVar15;
  Representation RVar16;
  int index;
  long in_FS_OFFSET;
  double dVar17;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (widgets->d).size;
  if (uVar3 != 0) {
    dVar17 = (double)(int)uVar3;
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    dVar17 = ceil(dVar17);
    iVar14 = (int)dVar17;
    if (iVar14 < 2) {
      iVar14 = 1;
    }
    uVar3 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
    iVar11 = (int)((long)uVar3 % (long)iVar14);
    iVar9 = ((int)((long)uVar3 / (long)iVar14) + 1) - (uint)(iVar11 == 0);
    iVar5 = 1;
    if (1 < iVar9) {
      iVar5 = iVar9;
    }
    iVar7 = (((domain->x2).m_i - (domain->x1).m_i) + 1) / iVar14;
    iVar6 = (((domain->y2).m_i - (domain->y1).m_i) + 1) / iVar5;
    index = 0;
    iVar12 = 0;
    do {
      RVar15.m_i = iVar12 * (iVar6 + 1);
      iVar10 = iVar6 + RVar15.m_i;
      RVar16.m_i = 0;
      iVar13 = 0;
      do {
        bVar4 = iVar14 - iVar11 <= iVar13;
        if ((iVar12 != 1) || (bVar4 || iVar11 == 0)) {
          iVar1 = (domain->x2).m_i;
          iVar2 = (domain->y2).m_i;
          bVar8 = sanityCheck(widgets,index,"RegularTiler");
          if (bVar8) {
            local_48.y2.m_i = iVar6 * 2 + 1;
            if (iVar9 == 2) {
              local_48.y2.m_i = iVar2;
            }
            if (bVar4 || iVar11 == 0) {
              local_48.y2.m_i = iVar10;
            }
            if (iVar12 != 0) {
              local_48.y2.m_i = iVar10;
            }
            if (iVar12 == iVar5 + -1) {
              local_48.y2.m_i = iVar2;
            }
            local_48.x2.m_i = iVar7 + RVar16.m_i;
            if (iVar13 - iVar14 == -1) {
              local_48.x2.m_i = iVar1;
            }
            this_00 = (widgets->d).ptr[index];
            local_48.y1.m_i = RVar15.m_i;
            local_48.x1.m_i = RVar16.m_i;
            index = index + 1;
            direction = QWidget::layoutDirection(this_00);
            local_58 = QStyle::visualRect(direction,domain,&local_48);
            QWidget::setGeometry(this_00,&local_58);
          }
        }
        iVar13 = iVar13 + 1;
        RVar16.m_i = RVar16.m_i + iVar7 + 1;
      } while (iVar13 != iVar14);
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void RegularTiler::rearrange(QList<QWidget *> &widgets, const QRect &domain) const
{
    if (widgets.isEmpty())
        return;

    const int n = widgets.size();
    const int ncols = qMax(qCeil(qSqrt(qreal(n))), 1);
    const int nrows = qMax((n % ncols) ? (n / ncols + 1) : (n / ncols), 1);
    const int nspecial = (n % ncols) ? (ncols - n % ncols) : 0;
    const int dx = domain.width()  / ncols;
    const int dy = domain.height() / nrows;

    int i = 0;
    for (int row = 0; row < nrows; ++row) {
        const int y1 = int(row * (dy + 1));
        for (int col = 0; col < ncols; ++col) {
            if (row == 1 && col < nspecial)
                continue;
            const int x1 = int(col * (dx + 1));
            int x2 = int(x1 + dx);
            int y2 = int(y1 + dy);
            if (row == 0 && col < nspecial) {
                y2 *= 2;
                if (nrows != 2)
                    y2 += 1;
                else
                    y2 = domain.bottom();
            }
            if (col == ncols - 1 && x2 != domain.right())
                x2 = domain.right();
            if (row == nrows - 1 && y2 != domain.bottom())
                y2 = domain.bottom();
            if (!sanityCheck(widgets, i, "RegularTiler"))
                continue;
            QWidget *widget = widgets.at(i++);
            QRect newGeometry = QRect(QPoint(x1, y1), QPoint(x2, y2));
            widget->setGeometry(QStyle::visualRect(widget->layoutDirection(), domain, newGeometry));
        }
    }
}